

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O1

void test_ADynArray_set_success_indexBeyondSize_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char **ppcVar5;
  char **ppcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcStack_90;
  char *pcStack_88;
  char *pcStack_80;
  char *local_78;
  char *local_70;
  char *local_68;
  undefined8 uStack_60;
  char c;
  private_ACUtilsTest_ADynArray_CharArray array;
  
  array.buffer = (char *)0x0;
  array.reallocator._0_4_ = 0x10a480;
  array.reallocator._4_4_ = 0;
  array.deallocator._0_4_ = 0x10a4c0;
  array.deallocator._4_4_ = 0;
  array.size = 3;
  array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
  array.capacity = 4;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  uStack_60 = 0x117a87;
  array.buffer = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,5);
  array.buffer[4] = '\0';
  builtin_strncpy(array.buffer,"012",4);
  private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
  private_ACUtilsTest_ADynArray_reallocFail = 1;
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  c = '3';
  uStack_60 = 0x117aca;
  bVar1 = private_ACUtils_ADynArray_setRange(&array,3,1,&c,1);
  if (bVar1 == true) {
    uStack_60 = 0x117ae4;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x674);
    if (array.size == 4) {
      uStack_60 = 0x117b04;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x675);
      if (array.capacity == 4) {
        uStack_60 = 0x117b24;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x676);
        if (array.buffer == (char *)0x0) {
          ppcVar6 = &local_68;
          pcVar4 = "Assertion \'_ck_x != NULL\' failed";
          pcVar3 = "Assertion \'%s\' failed: %s == %#x";
          pcVar7 = "(void*) array.buffer != NULL";
          pcVar8 = "(void*) array.buffer";
          iVar2 = 0x677;
LAB_00117d8d:
          uStack_60 = 0;
          local_68 = (char *)0x0;
          *(code **)((long)ppcVar6 + -8) =
               test_ADynArray_set_success_indexBeyondSize_bufferExpanded_fn;
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,iVar2,pcVar4,pcVar3,pcVar7,pcVar8);
        }
        uStack_60 = 0x117b41;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x677);
        if (array.growStrategy == (ACUtilsGrowStrategy)0x0) {
          ppcVar6 = &local_68;
          pcVar4 = "Assertion \'_ck_x != NULL\' failed";
          pcVar3 = "Assertion \'%s\' failed: %s == %#x";
          pcVar7 = "(void*) array.growStrategy != NULL";
          pcVar8 = "(void*) array.growStrategy";
          iVar2 = 0x678;
          goto LAB_00117d8d;
        }
        uStack_60 = 0x117b5e;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x678);
        pcStack_90 = array.buffer;
        if (array.buffer == (char *)0x0) {
          pcVar3 = "";
          pcStack_90 = "(null)";
        }
        else {
          uStack_60 = 0x117b7b;
          iVar2 = strcmp("0123",array.buffer);
          if (iVar2 == 0) {
            uStack_60 = 0x117b94;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x679);
            if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
              uStack_60 = 0x117bb5;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x67a);
              uStack_60 = 0x117bbe;
              (*(code *)CONCAT44(array.deallocator._4_4_,array.deallocator._0_4_))(array.buffer);
              return;
            }
            ppcVar6 = &local_78;
            local_70 = "0";
            local_78 = (char *)private_ACUtilsTest_ADynArray_reallocCount;
            pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar7 = "private_ACUtilsTest_ADynArray_reallocCount == 0";
            pcVar8 = "private_ACUtilsTest_ADynArray_reallocCount";
            iVar2 = 0x67a;
            goto LAB_00117d8d;
          }
          pcVar3 = "\"";
        }
        expr = 
        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
        ;
        pcVar8 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
        pcVar4 = "array.buffer == \"0123\"";
        pcVar7 = "array.buffer";
        iVar2 = 0x679;
        local_68 = "\"";
        local_70 = "0123";
        local_78 = "\"";
        pcStack_80 = "\"0123\"";
        ppcVar5 = &pcStack_90;
        pcStack_88 = pcVar3;
        goto LAB_00117d42;
      }
      pcVar4 = "array.capacity == 4";
      pcVar7 = "array.capacity";
      iVar2 = 0x676;
      pcVar3 = (char *)array.capacity;
    }
    else {
      pcVar4 = "array.size == 4";
      pcVar7 = "array.size";
      iVar2 = 0x675;
      pcVar3 = (char *)array.size;
    }
    local_70 = "4";
    local_68 = (char *)0x4;
  }
  else {
    pcVar3 = (char *)(ulong)bVar1;
    local_70 = "true";
    pcVar4 = 
    "private_ACUtils_ADynArray_setRange(&array, 3, 1, &(c), sizeof(*(&array)->buffer)) == true";
    pcVar7 = "private_ACUtils_ADynArray_setRange(&array, 3, 1, &(c), sizeof(*(&array)->buffer))";
    iVar2 = 0x674;
    local_68 = (char *)0x1;
  }
  expr = "Assertion \'_ck_x == _ck_y\' failed";
  pcVar8 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
  ppcVar5 = &local_70;
LAB_00117d42:
  uStack_60 = 0;
  *(char **)((long)ppcVar5 + -8) = pcVar3;
  *(undefined8 *)((long)ppcVar5 + -0x10) = 0x117d49;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar2,expr,pcVar8,pcVar4,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_set_success_indexBeyondSize)
{
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = 3;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = 4;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity + 1);
    memcpy(array.buffer, "012\0\0", 5);
    private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
    private_ACUtilsTest_ADynArray_reallocFail = true;
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    char c = '3';
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_set(&array, 3, c), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, 4);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, 4);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    ACUTILSTEST_ASSERT_STR_EQ(array.buffer, "0123");
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    array.deallocator(array.buffer);
}